

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O3

bool cppcms::sessions::impl::hmac_cipher::equal(void *a,void *b,size_t n)

{
  size_t sVar1;
  long lVar2;
  
  if (n != 0) {
    sVar1 = 0;
    lVar2 = 0;
    do {
      lVar2 = lVar2 + (ulong)(*(char *)((long)a + sVar1) != *(char *)((long)b + sVar1));
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
    return lVar2 == 0;
  }
  return true;
}

Assistant:

bool hmac_cipher::equal(void const *a,void const *b,size_t n)
{
	char const *left = static_cast<char const *>(a);
	char const *right = static_cast<char const *>(b);
	size_t diff = 0;
	for(size_t i=0;i<n;i++) {
		if(left[i]!=right[i])
			diff++;
	}
	return diff==0;
}